

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

TokenType __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
skip(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
     *this)

{
  TokenType TVar1;
  UTF8Reader local_20;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *local_18;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *this_local;
  TokenType last;
  
  local_18 = this;
  if ((this->shouldIgnoreComments & 1U) == 0) {
    UTF8Reader::findEndOfWhitespace(&local_20);
    UTF8Reader::operator=(&this->input,&local_20);
  }
  else {
    skipWhitespaceAndComments(this);
  }
  UTF8Reader::operator=(&(this->location).location,&this->input);
  this_local = (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                *)(this->currentType).text;
  TVar1 = matchNextToken(this);
  (this->currentType).text = TVar1.text;
  return (TokenType)(char *)this_local;
}

Assistant:

TokenType skip()
    {
        if (shouldIgnoreComments)
            skipWhitespaceAndComments();
        else
            input = input.findEndOfWhitespace();

        location.location = input;
        auto last = currentType;
        currentType = matchNextToken();
        return last;
    }